

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O3

void Bac_ManWriteBlifGate(FILE *pFile,Bac_Ntk_t *p,Mio_Gate_t *pGate,Vec_Int_t *vFanins,int iObj)

{
  int i;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  if (0 < vFanins->nSize) {
    lVar3 = 0;
    do {
      i = vFanins->pArray[lVar3];
      pcVar1 = Mio_GateReadPinName(pGate,(int)lVar3);
      pcVar2 = Bac_ObjNameStr(p,i);
      fprintf((FILE *)pFile," %s=%s",pcVar1,pcVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vFanins->nSize);
  }
  pcVar1 = Mio_GateReadOutName(pGate);
  pcVar2 = Bac_ObjNameStr(p,iObj);
  fprintf((FILE *)pFile," %s=%s",pcVar1,pcVar2);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Bac_ManWriteBlifGate( FILE * pFile, Bac_Ntk_t * p, Mio_Gate_t * pGate, Vec_Int_t * vFanins, int iObj )
{
    int iFanin, i;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, i), Bac_ObjNameStr(p, iFanin) );
    fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );
}